

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  _xmlDoc *p_Var1;
  _xmlNs **pp_Var2;
  xmlElementType xVar3;
  int iVar4;
  int iVar5;
  _xmlNode *attr;
  xmlChar *pxVar6;
  xmlNsPtr cur;
  xmlEntityPtr pxVar7;
  xmlNsMapItemPtr_conflict pxVar8;
  xmlChar *pxVar9;
  xmlNsPtr *ppxVar10;
  xmlNsMapItemPtr_conflict pxVar11;
  xmlNs *ns;
  xmlNodePtr pxVar12;
  _xmlNode *cur_00;
  int depth;
  xmlNodePtr pxVar13;
  xmlNsMapItemPtr pxVar14;
  ulong uVar15;
  xmlNsPtr pxVar16;
  xmlDocPtr doc;
  _xmlNode *p_Var17;
  xmlNodePtr pxVar18;
  int in_stack_ffffffffffffff60;
  xmlNsMapPtr nsMap;
  xmlNodePtr local_80;
  _xmlNs *local_78;
  xmlDocPtr local_70;
  ulong local_68;
  xmlNodePtr local_60;
  _xmlDict *local_58;
  xmlNodePtr local_50;
  xmlNodePtr local_48;
  int local_3c;
  _xmlDoc *local_38;
  
  nsMap = (xmlNsMapPtr)0x0;
  if (destDoc == (xmlDocPtr)0x0 || (resNode == (xmlNodePtr *)0x0 || node == (xmlNodePtr)0x0)) {
    return -1;
  }
  if ((destParent != (xmlNodePtr)0x0) && (destParent->doc != destDoc)) {
    return -1;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return 1;
  }
  p_Var1 = node->doc;
  if ((p_Var1 != sourceDoc && p_Var1 != (_xmlDoc *)0x0) && sourceDoc != (xmlDocPtr)0x0) {
    return -1;
  }
  local_38 = sourceDoc;
  if (sourceDoc == (xmlDocPtr)0x0) {
    local_38 = p_Var1;
  }
  if (sourceDoc == (xmlDocPtr)0x0 && p_Var1 == (_xmlDoc *)0x0) {
    return -1;
  }
  if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    nsMap = (xmlNsMapPtr)ctxt->namespaceMap;
  }
  local_58 = destDoc->dict;
  *resNode = (xmlNodePtr)0x0;
  local_68 = 0;
  depth = -1;
  local_50 = (xmlNodePtr)0x0;
  local_60 = (xmlNodePtr)0x0;
  pxVar13 = node;
  p_Var17 = (_xmlNode *)0x0;
  pxVar18 = (xmlNodePtr)0x0;
  local_70 = destDoc;
  local_48 = destParent;
LAB_0014bd03:
  cur_00 = pxVar13;
  iVar5 = -1;
  iVar4 = -1;
  if ((cur_00->doc == local_38) && (xVar3 = cur_00->type, iVar4 = iVar5, xVar3 < XML_NOTATION_NODE))
  {
    local_80 = pxVar18;
    if ((0x9baU >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if ((xVar3 != XML_ATTRIBUTE_NODE) ||
         (attr = (_xmlNode *)(*xmlMalloc)(0x68), attr == (_xmlNode *)0x0))
      goto switchD_0014be9a_caseD_6;
      attr->content = (xmlChar *)0x0;
      attr->properties = (_xmlAttr *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->ns = (xmlNs *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlNode *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->nsDef = (xmlNs *)0x0;
      if (local_60 == (xmlNodePtr)0x0) goto LAB_0014be20;
      attr->parent = local_80;
      if (p_Var17 == (_xmlNode *)0x0) {
        local_80->properties = (_xmlAttr *)attr;
      }
      else {
        p_Var17->next = attr;
        attr->prev = p_Var17;
      }
    }
    else {
      attr = (_xmlNode *)(*xmlMalloc)(0x78);
      if (attr == (_xmlNode *)0x0) goto switchD_0014be9a_caseD_6;
      attr->nsDef = (xmlNs *)0x0;
      attr->psvi = (void *)0x0;
      attr->content = (xmlChar *)0x0;
      attr->properties = (_xmlAttr *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->ns = (xmlNs *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlNode *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->line = 0;
      attr->extra = 0;
      *(undefined4 *)&attr->field_0x74 = 0;
      if (local_60 == (xmlNodePtr)0x0) {
LAB_0014be20:
        local_60 = attr;
      }
      else {
        attr->parent = local_80;
        if (p_Var17 == (_xmlNode *)0x0) {
          local_80->children = attr;
        }
        else {
          p_Var17->next = attr;
          attr->prev = p_Var17;
        }
        local_80->last = attr;
      }
    }
    doc = local_70;
    pxVar9 = "text";
    xVar3 = cur_00->type;
    attr->type = xVar3;
    attr->doc = local_70;
    pxVar6 = cur_00->name;
    if (((pxVar6 == "text") || (pxVar9 = "textnoenc", pxVar6 == "textnoenc")) ||
       (pxVar9 = "comment", pxVar6 == "comment")) {
      attr->name = pxVar9;
    }
    else if (pxVar6 != (xmlChar *)0x0) {
      if (local_58 == (xmlDictPtr)0x0) {
        pxVar6 = xmlStrdup(pxVar6);
      }
      else {
        pxVar6 = xmlDictLookup(local_58,pxVar6,-1);
      }
      attr->name = pxVar6;
      if (pxVar6 == (xmlChar *)0x0) goto switchD_0014be9a_caseD_6;
      xVar3 = cur_00->type;
    }
    pxVar12 = local_80;
    switch(xVar3) {
    case XML_ELEMENT_NODE:
      depth = depth + 1;
      if (cur_00->nsDef == (xmlNs *)0x0) {
        local_50 = attr;
      }
      else {
        iVar5 = (int)local_68;
        uVar15 = (ulong)(iVar5 + (uint)(iVar5 == 0));
        if ((iVar5 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) && local_48 != (xmlNodePtr)0x0)
        {
          iVar5 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,local_48);
          uVar15 = 1;
          if (iVar5 == -1) break;
        }
        local_78 = (_xmlNs *)&cur_00->nsDef;
        pxVar16 = (xmlNsPtr)&attr->nsDef;
        local_68 = uVar15;
        while (pp_Var2 = &local_78->next, local_78 = *pp_Var2, *pp_Var2 != (_xmlNs *)0x0) {
          cur = (xmlNsPtr)(*xmlMalloc)(0x30);
          if (cur == (xmlNsPtr)0x0) goto LAB_0014c406;
          cur->next = (_xmlNs *)0x0;
          *(undefined8 *)&cur->type = 0;
          cur->_private = (void *)0x0;
          cur->context = (_xmlDoc *)0x0;
          cur->href = (xmlChar *)0x0;
          cur->prefix = (xmlChar *)0x0;
          cur->type = XML_NAMESPACE_DECL;
          if (local_78->href != (xmlChar *)0x0) {
            pxVar6 = xmlStrdup(local_78->href);
            cur->href = pxVar6;
            if (pxVar6 != (xmlChar *)0x0) goto LAB_0014bf89;
LAB_0014c3fe:
            xmlFreeNs(cur);
            goto LAB_0014c406;
          }
LAB_0014bf89:
          if (local_78->prefix != (xmlChar *)0x0) {
            pxVar6 = xmlStrdup(local_78->prefix);
            cur->prefix = pxVar6;
            if (pxVar6 == (xmlChar *)0x0) goto LAB_0014c3fe;
          }
          pxVar16->next = cur;
          pxVar16 = cur;
          if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
             (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
            if ((nsMap != (xmlNsMapPtr)0x0) &&
               (pxVar8 = nsMap->first, pxVar8 != (xmlNsMapItemPtr_conflict)0x0)) {
              for (; pxVar8 != (xmlNsMapItemPtr_conflict)0x0; pxVar8 = pxVar8->next) {
                if ((-2 < pxVar8->depth) && (pxVar8->shadowDepth == -1)) {
                  pxVar6 = pxVar8->newNs->prefix;
                  if ((local_78->prefix == pxVar6) ||
                     (iVar4 = xmlStrEqual(local_78->prefix,pxVar6), iVar4 != 0)) {
                    pxVar8->shadowDepth = depth;
                  }
                }
              }
            }
            pxVar8 = xmlDOMWrapNsMapAddItem(&nsMap,-1,local_78,cur,depth);
            if (pxVar8 == (xmlNsMapItemPtr_conflict)0x0) {
LAB_0014c406:
              iVar4 = -1;
              goto LAB_0014c3b0;
            }
          }
        }
        local_50 = attr;
        doc = local_70;
      }
    case XML_ATTRIBUTE_NODE:
      iVar4 = -1;
      if (cur_00->ns != (xmlNs *)0x0) {
        iVar5 = (int)local_68;
        local_68 = (ulong)(iVar5 + (uint)(iVar5 == 0));
        if ((iVar5 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) && local_48 != (xmlNodePtr)0x0)
        {
          iVar5 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,local_48);
          local_68 = 1;
          if (iVar5 == -1) break;
        }
        if ((nsMap != (xmlNsMapPtr)0x0) &&
           (pxVar8 = nsMap->first, pxVar8 != (xmlNsMapItemPtr_conflict)0x0)) {
          for (; pxVar8 != (xmlNsMapItemPtr_conflict)0x0; pxVar8 = pxVar8->next) {
            if ((pxVar8->shadowDepth == -1) && (cur_00->ns == pxVar8->oldNs)) {
              ppxVar10 = &pxVar8->newNs;
              goto LAB_0014c21a;
            }
          }
        }
        if (ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) {
          ns = cur_00->ns;
LAB_0014c1d5:
          pxVar13 = local_50;
          if (local_48 == (xmlNodePtr)0x0) {
            pxVar13 = (xmlNodePtr)0x0;
          }
          iVar5 = xmlDOMWrapNSNormAcquireNormalizedNs
                            (doc,pxVar13,ns,&local_78,&nsMap,depth,
                             (uint)(cur_00->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff60);
          ppxVar10 = &local_78;
          if (iVar5 == -1) break;
        }
        else {
          ns = cur_00->ns;
          if (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0) goto LAB_0014c1d5;
          local_78 = (*ctxt->getNsForNodeFunc)(ctxt,cur_00,ns->href,ns->prefix);
          pxVar8 = xmlDOMWrapNsMapAddItem(&nsMap,-1,cur_00->ns,local_78,-4);
          ppxVar10 = &local_78;
          if (pxVar8 == (xmlNsMapItemPtr_conflict)0x0) {
            iVar4 = -1;
            if (nsMap == (xmlNsMapPtr)0x0) goto LAB_0014c3ca;
            goto LAB_0014c3bf;
          }
        }
LAB_0014c21a:
        attr->ns = *ppxVar10;
      }
      if ((attr->type == XML_ATTRIBUTE_NODE) && (attr->parent != (xmlNodePtr)0x0)) {
        iVar5 = xmlIsID(doc,attr->parent,(xmlAttrPtr)attr);
        if (iVar5 < 0) break;
        if (iVar5 == 1) {
          pxVar6 = xmlNodeGetContent(cur_00);
          if (pxVar6 == (xmlChar *)0x0) break;
          local_3c = xmlAddIDSafe((xmlAttrPtr)cur_00,pxVar6);
          (*xmlFree)(pxVar6);
          if (local_3c < 0) break;
        }
      }
      pxVar12 = local_80;
      if (cur_00->type == XML_ELEMENT_NODE) goto code_r0x0014c293;
      goto LAB_0014c2bd;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
      if (cur_00->content == (xmlChar *)0x0) goto LAB_0014c2e4;
      pxVar6 = xmlStrdup(cur_00->content);
      attr->content = pxVar6;
      pxVar12 = local_80;
      if (pxVar6 != (xmlChar *)0x0) goto LAB_0014c2e4;
      break;
    case XML_ENTITY_REF_NODE:
      if (local_38 == doc) {
        attr->content = cur_00->content;
        attr->children = cur_00->children;
        pxVar7 = (xmlEntityPtr)cur_00->last;
      }
      else {
        if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0))
        goto LAB_0014c2e4;
        pxVar7 = xmlGetDocEntity(doc,cur_00->name);
        pxVar12 = local_80;
        if (pxVar7 == (xmlEntityPtr)0x0) goto LAB_0014c2e4;
        attr->content = pxVar7->content;
        attr->children = (_xmlNode *)pxVar7;
      }
      attr->last = (_xmlNode *)pxVar7;
      pxVar12 = local_80;
      goto LAB_0014c2e4;
    default:
      break;
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      return -1;
    }
  }
switchD_0014be9a_caseD_6:
LAB_0014c3b0:
  if (nsMap != (xmlNsMapPtr)0x0) {
    if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
LAB_0014c3bf:
      if ((xmlNsMapPtr)ctxt->namespaceMap == nsMap) {
        pxVar8 = nsMap->first;
        if (pxVar8 != (xmlNsMapItemPtr_conflict)0x0) {
          if (nsMap->pool != (xmlNsMapItemPtr_conflict)0x0) {
            nsMap->last->next = nsMap->pool;
            pxVar8 = nsMap->first;
          }
          nsMap->pool = pxVar8;
          nsMap->first = (xmlNsMapItemPtr_conflict)0x0;
        }
        goto LAB_0014c3ca;
      }
    }
    xmlDOMWrapNsMapFree(nsMap);
  }
LAB_0014c3ca:
  *resNode = local_60;
  return iVar4;
code_r0x0014c293:
  p_Var17 = (_xmlNode *)0x0;
  pxVar13 = (xmlNode *)cur_00->properties;
  pxVar18 = attr;
  if ((xmlNode *)cur_00->properties == (xmlNode *)0x0) {
LAB_0014c2bd:
    for (; (cur_00->children == (_xmlNode *)0x0 ||
           ((deep == 0 && (cur_00->type != XML_ATTRIBUTE_NODE)))); cur_00 = cur_00->parent) {
LAB_0014c2e4:
      while( true ) {
        if (cur_00 == node) {
          iVar4 = 0;
          goto switchD_0014be9a_caseD_6;
        }
        xVar3 = cur_00->type;
        if ((xVar3 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
           ((0x180002U >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
          if ((nsMap != (xmlNsMapPtr)0x0) && (nsMap->first != (xmlNsMapItemPtr_conflict)0x0)) {
            while ((pxVar8 = nsMap->last, pxVar11 = (xmlNsMapItemPtr_conflict)nsMap,
                   pxVar8 != (xmlNsMapItemPtr_conflict)0x0 && (depth <= pxVar8->depth))) {
              pxVar14 = pxVar8->prev;
              nsMap->last = pxVar14;
              if (pxVar14 == (xmlNsMapItemPtr)0x0) {
                pxVar14 = (xmlNsMapItemPtr)nsMap;
              }
              pxVar14->next = (xmlNsMapItemPtr_conflict)0x0;
              pxVar8->next = nsMap->pool;
              nsMap->pool = pxVar8;
            }
            while (pxVar11 = pxVar11->next, pxVar11 != (xmlNsMapItemPtr_conflict)0x0) {
              if (depth <= pxVar11->shadowDepth) {
                pxVar11->shadowDepth = -1;
              }
            }
          }
          depth = depth + -1;
        }
        pxVar13 = cur_00->next;
        p_Var17 = attr;
        pxVar18 = pxVar12;
        if (cur_00->next != (_xmlNode *)0x0) goto LAB_0014bd03;
        attr = attr->parent;
        if (xVar3 == XML_ATTRIBUTE_NODE) break;
        if (attr != (_xmlNode *)0x0) {
          pxVar12 = attr->parent;
        }
        cur_00 = cur_00->parent;
      }
      pxVar12 = attr->parent;
    }
    p_Var17 = (_xmlNode *)0x0;
    pxVar13 = cur_00->children;
    pxVar18 = attr;
  }
  goto LAB_0014bd03;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, cloneElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
                    parentClone->last = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
		clone = xmlMalloc(sizeof(xmlAttr));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
            if (dict != NULL)
                clone->name = xmlDictLookup(dict, cur->name, -1);
            else
                clone->name = xmlStrdup(cur->name);
            if (clone->name == NULL)
                goto internal_error;
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		cloneElem = clone;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL)
			    goto internal_error;
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL) {
			    cloneNs->href = xmlStrdup(ns->href);
                            if (cloneNs->href == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }
			if (ns->prefix != NULL) {
			    cloneNs->prefix = xmlStrdup(ns->prefix);
                            if (cloneNs->prefix == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
                if (cur->content != NULL) {
                    clone->content = xmlStrdup(cur->content);
                    if (clone->content == NULL)
                        goto internal_error;
                }
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on cloneElem or on destDoc->oldNs */
		destParent ? cloneElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
            int res;

	    res = xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone);
            if (res < 0)
                goto internal_error;
            if (res == 1) {
		xmlChar *idVal;

		idVal = xmlNodeGetContent(cur);
                if (idVal == NULL)
                    goto internal_error;
                if (xmlAddIDSafe((xmlAttrPtr) cur, idVal) < 0) {
                    xmlFree(idVal);
                    goto internal_error;
                }
                xmlFree(idVal);
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}